

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_util.c
# Opt level: O2

int aom_compare_img(aom_image_t *img1,aom_image_t *img2)

{
  int iVar1;
  aom_img_fmt_t aVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint32_t i;
  uint uVar10;
  int plane;
  long lVar11;
  uint uVar12;
  
  iVar1 = img1->monochrome;
  aVar2 = img1->fmt;
  uVar3 = img1->d_w;
  uVar4 = img1->x_chroma_shift;
  uVar5 = img1->d_h;
  uVar6 = img1->y_chroma_shift;
  uVar12 = (uint)(img2->d_h == uVar5 && (img2->d_w == uVar3 && img2->fmt == aVar2));
  for (lVar11 = 0; lVar11 != (ulong)(iVar1 == 0) * 2 + 1; lVar11 = lVar11 + 1) {
    uVar7 = uVar6 + uVar5 >> ((byte)uVar6 & 0x1f);
    uVar8 = uVar4 + uVar3 >> ((byte)uVar4 & 0x1f);
    if (lVar11 == 0) {
      uVar7 = uVar5;
      uVar8 = uVar3;
    }
    for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
      iVar9 = bcmp(img1->planes[lVar11] + img1->stride[lVar11] * uVar10,
                   img2->planes[lVar11] + img2->stride[lVar11] * uVar10,
                   (ulong)(uVar8 << ((byte)(aVar2 >> 0xb) & 1)));
      uVar12 = uVar12 & iVar9 == 0;
    }
  }
  return uVar12;
}

Assistant:

int aom_compare_img(const aom_image_t *const img1,
                    const aom_image_t *const img2) {
  assert(img1->cp == img2->cp);
  assert(img1->tc == img2->tc);
  assert(img1->mc == img2->mc);
  assert(img1->monochrome == img2->monochrome);

  int num_planes = img1->monochrome ? 1 : 3;

  uint32_t l_w = img1->d_w;
  uint32_t c_w = (img1->d_w + img1->x_chroma_shift) >> img1->x_chroma_shift;
  const uint32_t c_h =
      (img1->d_h + img1->y_chroma_shift) >> img1->y_chroma_shift;
  int match = 1;

  match &= (img1->fmt == img2->fmt);
  match &= (img1->d_w == img2->d_w);
  match &= (img1->d_h == img2->d_h);
  if (img1->fmt & AOM_IMG_FMT_HIGHBITDEPTH) {
    l_w *= 2;
    c_w *= 2;
  }

  for (int plane = 0; plane < num_planes; ++plane) {
    uint32_t height = plane ? c_h : img1->d_h;
    uint32_t width = plane ? c_w : l_w;

    for (uint32_t i = 0; i < height; ++i) {
      match &=
          (memcmp(img1->planes[plane] + i * img1->stride[plane],
                  img2->planes[plane] + i * img2->stride[plane], width) == 0);
    }
  }

  return match;
}